

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ConcatenationExpression::fromEmpty
          (Compilation *compilation,EmptyQueueExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Expression *pEVar4;
  Diagnostic *pDVar5;
  ConstantRange CVar6;
  ConcatenationExpression *pCVar7;
  int iVar8;
  Type *pTVar9;
  DiagCode code;
  SourceRange SVar10;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_48;
  SourceRange local_30;
  
  if (assignmentTarget == (Type *)0x0) {
LAB_0038c745:
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x4e;
  }
  else {
    bVar1 = Type::isUnpackedArray(assignmentTarget);
    pTVar9 = assignmentTarget->canonical;
    if (!bVar1) {
      if (pTVar9 == (Type *)0x0) {
        Type::resolveCanonical(assignmentTarget);
        pTVar9 = assignmentTarget->canonical;
      }
      if ((pTVar9->super_Symbol).kind == ErrorType) goto LAB_0038c760;
      goto LAB_0038c745;
    }
    if (pTVar9 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar9 = assignmentTarget->canonical;
    }
    if ((pTVar9->super_Symbol).kind != AssociativeArrayType) {
      bVar1 = Type::hasFixedRange(assignmentTarget);
      if (bVar1) {
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        pDVar5 = ASTContext::addDiag(context,(DiagCode)0xa70007,SVar10);
        pDVar5 = ast::operator<<(pDVar5,assignmentTarget);
        CVar6 = Type::getFixedRange(assignmentTarget);
        iVar2 = CVar6.left;
        iVar8 = CVar6.right;
        iVar3 = iVar2 - iVar8;
        if (iVar2 - iVar8 == 0 || iVar2 < iVar8) {
          iVar3 = -(iVar2 - iVar8);
        }
        local_48._M_ptr = (pointer)(ulong)(iVar3 + 1);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_48);
        local_48._M_ptr = (pointer)0x0;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar5->args,(long *)&local_48);
        pCVar7 = (ConcatenationExpression *)Expression::badExpr(compilation,(Expression *)0x0);
      }
      else {
        local_48._M_ptr = (pointer)0x0;
        local_48._M_extent._M_extent_value = 0;
        local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        pCVar7 = BumpAllocator::
                 emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                           (&compilation->super_BumpAllocator,assignmentTarget,&local_48,&local_30);
      }
      return &pCVar7->super_Expression;
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0xa6;
  }
  ASTContext::addDiag(context,code,SVar10);
LAB_0038c760:
  pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar4;
}

Assistant:

Expression& ConcatenationExpression::fromEmpty(Compilation& compilation,
                                               const EmptyQueueExpressionSyntax& syntax,
                                               const ASTContext& context,
                                               const Type* assignmentTarget) {
    // Empty concatenation can only target arrays.
    if (!assignmentTarget || !assignmentTarget->isUnpackedArray()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->isAssociativeArray()) {
        context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->hasFixedRange()) {
        context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
            << *assignmentTarget << assignmentTarget->getFixedRange().width() << 0;
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<ConcatenationExpression>(*assignmentTarget,
                                                         std::span<const Expression* const>{},
                                                         syntax.sourceRange());
}